

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O3

void __thiscall NaPNFetcher::set_sum_weights(NaPNFetcher *this,NaReal *pfWeights)

{
  int iVar1;
  undefined1 auVar2 [16];
  NaReal *__dest;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  long lVar6;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  iVar1 = this->nOutDim;
  lVar3 = (long)iVar1;
  if (lVar3 < 0) {
    if (this->pfSumWeights != (NaReal *)0x0) {
      operator_delete__(this->pfSumWeights);
    }
    this->pfSumWeights = (NaReal *)0x0;
  }
  else {
    __dest = (NaReal *)operator_new__(lVar3 * 8);
    this->pfSumWeights = __dest;
    auVar2 = _DAT_0015cfb0;
    if (pfWeights == (NaReal *)0x0) {
      if (iVar1 != 0) {
        lVar3 = lVar3 + -1;
        auVar4._8_4_ = (int)lVar3;
        auVar4._0_8_ = lVar3;
        auVar4._12_4_ = (int)((ulong)lVar3 >> 0x20);
        lVar3 = 0;
        auVar4 = auVar4 ^ _DAT_0015cfb0;
        auVar5 = _DAT_0015cfa0;
        do {
          auVar7 = auVar5 ^ auVar2;
          if ((bool)(~(auVar7._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar7._0_4_ ||
                      auVar4._4_4_ < auVar7._4_4_) & 1)) {
            *(undefined8 *)((long)__dest + lVar3) = 0x3ff0000000000000;
          }
          if ((auVar7._12_4_ != auVar4._12_4_ || auVar7._8_4_ <= auVar4._8_4_) &&
              auVar7._12_4_ <= auVar4._12_4_) {
            *(undefined8 *)((long)__dest + lVar3 + 8) = 0x3ff0000000000000;
          }
          lVar6 = auVar5._8_8_;
          auVar5._0_8_ = auVar5._0_8_ + 2;
          auVar5._8_8_ = lVar6 + 2;
          lVar3 = lVar3 + 0x10;
        } while ((ulong)(iVar1 + 1U >> 1) << 4 != lVar3);
      }
    }
    else if (iVar1 != 0) {
      memcpy(__dest,pfWeights,lVar3 * 8);
      return;
    }
  }
  return;
}

Assistant:

void
NaPNFetcher::set_sum_weights (const NaReal* pfWeights)
{
  check_tunable();

  if(nOutDim < 0)
    {
      delete[] pfSumWeights;
      pfSumWeights = NULL;
    }
  else
    {
      int	i;
      pfSumWeights = new NaReal[nOutDim];
      if(NULL == pfWeights)
	for(i = 0; i < nOutDim; ++i)
	  pfSumWeights[i] = 1.0;
      else
	for(i = 0; i < nOutDim; ++i)
	  pfSumWeights[i] = pfWeights[i];
    }
}